

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialize.hpp
# Opt level: O1

void write<unsigned_int>(vector<unsigned_int,_std::allocator<unsigned_int>_> *v,ostream *stream)

{
  uint64_t size;
  uint64_t local_20;
  
  std::ostream::write((char *)stream,0x128f3e);
  local_20 = (long)(v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2;
  swapEndianness(&local_20);
  std::ostream::write((char *)stream,(long)&local_20);
  std::ostream::write((char *)stream,
                      (long)(v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                            _M_impl.super__Vector_impl_data._M_start);
  return;
}

Assistant:

void write(const std::vector<T> & v, std::ostream & stream)
{
  static_assert(SerializationTraits<T>::IsSerializable, "write(): Vector element type is not serializable");

  // Write TAG(4B), SIZE(8B), VALUES...
  stream.write(SerializationTraits<T>::VectorTag(), 4);
  std::uint64_t size = v.size();
  swapEndianness(size);
  stream.write(reinterpret_cast<char *>(&size), sizeof(size));

  if (SerializationTraits<T>::IsEndiannessDependent) {
#ifdef IS_BIG_ENDIAN
    std::vector<T> duplicate = v;
    for (T & value : duplicate) {
      swapEndianness(value);
    }
    stream.write(duplicate.data(), duplicate.size() * sizeof(T));
#else
    stream.write(reinterpret_cast<const char *>(v.data()), v.size() * sizeof(T));
#endif
  } else {
    stream.write(reinterpret_cast<const char *>(v.data()), v.size() * sizeof(T));
  }
}